

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModifiedPage.cpp
# Opt level: O0

uchar __thiscall PDFModifiedPage::GetDifferentChar(PDFModifiedPage *this,uchar inCharCode)

{
  uchar inCharCode_local;
  PDFModifiedPage *this_local;
  
  if ((inCharCode < 0x30) || (0x38 < inCharCode)) {
    if (inCharCode == '9') {
      this_local._7_1_ = '0';
    }
    else if ((inCharCode < 0x61) || (0x79 < inCharCode)) {
      if (inCharCode == 'z') {
        this_local._7_1_ = 'a';
      }
      else if ((inCharCode < 0x41) || (0x59 < inCharCode)) {
        if (inCharCode == 'Z') {
          this_local._7_1_ = 'A';
        }
        else {
          this_local._7_1_ = 'A';
        }
      }
      else {
        this_local._7_1_ = inCharCode + '\x01';
      }
    }
    else {
      this_local._7_1_ = inCharCode + '\x01';
    }
  }
  else {
    this_local._7_1_ = inCharCode + '\x01';
  }
  return this_local._7_1_;
}

Assistant:

unsigned char PDFModifiedPage::GetDifferentChar(unsigned char inCharCode)
{
    // numerals
    if(inCharCode >= 0x30 && inCharCode <= 0x38)
        return inCharCode+1;
    if(inCharCode == 0x39)
        return 0x30;

    // lowercase
    if(inCharCode >= 0x61 && inCharCode <= 0x79)
        return inCharCode+1;
    if(inCharCode == 0x7a)
        return 0x61;

    // uppercase
    if(inCharCode >= 0x41 && inCharCode <= 0x59)
        return inCharCode+1;
    if(inCharCode == 0x5a)
        return 0x41;

    return 0x41;
}